

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_cast.c
# Opt level: O3

int l2_cast_hex_str_to_int(char *s)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  
  l2_assert_func((long)s,L2_INTERNAL_ERROR_NULL_POINTER,"l2_cast_hex_str_to_int",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_cast.c"
                 ,0xb);
  bVar7 = *s;
  if (bVar7 == 0) {
    iVar3 = 0;
  }
  else {
    sVar2 = strlen(s);
    uVar4 = 0;
    iVar3 = 0;
    do {
      iVar5 = 1;
      iVar1 = (int)sVar2;
      if (1 < iVar1) {
        iVar6 = 1;
        do {
          iVar5 = iVar5 << 3;
          iVar6 = iVar6 + 1;
        } while (iVar1 != iVar6);
      }
      if ((byte)(bVar7 - 0x30) < 10) {
        uVar4 = (uint)(byte)(bVar7 - 0x30);
      }
      else if ((byte)(bVar7 + 0x9f) < 6) {
        uVar4 = bVar7 - 0x57;
      }
      else if ((byte)(bVar7 + 0xbf) < 6) {
        uVar4 = bVar7 - 0x37;
      }
      sVar2 = (size_t)(iVar1 - 1);
      iVar3 = iVar3 + iVar5 * uVar4;
      bVar7 = s[1];
      s = s + 1;
    } while (bVar7 != 0);
  }
  return iVar3;
}

Assistant:

int l2_cast_hex_str_to_int(const char *s) {
    l2_assert(s, L2_INTERNAL_ERROR_NULL_POINTER);
    const char *p;
    int ans = 0, n = strlen(s), digit = 0, factor;
    for (p = s; *p != '\0'; p++) {
        l2_pow(factor, 8, n - 1);
        if (*p >= '0' && *p <= '9') {
            digit = *p - '0';
        } else if (*p >= 'a' && *p <= 'f') {
            digit = *p - 'a' + 10;
        } else if (*p >= 'A' && *p <= 'F') {
            digit = *p - 'A' + 10;
        }
        ans += factor * digit;
        n -= 1;
    }
    return ans;
}